

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_selectable_image_text
              (nk_context *ctx,nk_image img,char *str,int len,nk_flags align,int *value)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  nk_context *in;
  nk_rect bounds;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x51a5,
                  "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
                 );
  }
  if (value == (int *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x51a6,
                  "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
                 );
  }
  pnVar1 = ctx->current;
  if (pnVar1 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x51a7,
                  "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
                 );
  }
  pnVar2 = pnVar1->layout;
  if (pnVar2 != (nk_panel *)0x0) {
    nVar3 = nk_widget(&bounds,ctx);
    if (nVar3 != NK_WIDGET_INVALID) {
      if (nVar3 == NK_WIDGET_ROM) {
        in = (nk_context *)0x0;
      }
      else {
        in = (nk_context *)0x0;
        if ((pnVar2->flags & 0x1000) == 0) {
          in = ctx;
        }
      }
      nVar3 = nk_do_selectable_image
                        (&ctx->last_widget_state,&pnVar1->buffer,bounds,str,len,align,value,&img,
                         &(ctx->style).selectable,&in->input,(ctx->style).font);
    }
    return nVar3;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x51a8,
                "int nk_selectable_image_text(struct nk_context *, struct nk_image, const char *, int, nk_flags, int *)"
               );
}

Assistant:

NK_API int
nk_selectable_image_text(struct nk_context *ctx, struct nk_image img,
    const char *str, int len, nk_flags align, int *value)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    const struct nk_style *style;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(value);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !value)
        return 0;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;

    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_selectable_image(&ctx->last_widget_state, &win->buffer, bounds,
                str, len, align, value, &img, &style->selectable, in, style->font);
}